

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

void google::protobuf::uint128::DivModImpl
               (uint128 dividend,uint128 divisor,uint128 *quotient_ret,uint128 *remainder_ret)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  uint64 extraout_RDX;
  uint64 extraout_RDX_00;
  uint128 n;
  uint128 n_00;
  uint128 local_128;
  uint64 local_118;
  uint64 local_110;
  uint64 local_108;
  unsigned_long local_100;
  int local_f4;
  undefined1 auStack_f0 [4];
  int shift;
  uint128 quotient;
  uint128 position;
  uint128 denominator;
  uint64 local_b8;
  uint128 local_b0;
  uint128 local_a0;
  LogFinisher local_8d [13];
  LogMessage local_80;
  uint128 local_48;
  uint128 *local_38;
  uint128 *remainder_ret_local;
  uint128 *quotient_ret_local;
  uint128 divisor_local;
  uint128 dividend_local;
  
  n.lo_ = dividend.hi_;
  divisor_local.hi_ = dividend.lo_;
  divisor_local.lo_ = divisor.hi_;
  quotient_ret_local = (uint128 *)divisor.lo_;
  local_38 = remainder_ret;
  remainder_ret_local = quotient_ret;
  uint128(&local_48,0);
  bVar1 = protobuf::operator==((uint128 *)&quotient_ret_local,&local_48);
  if (bVar1) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/int128.cc"
               ,0x55);
    pLVar3 = internal::LogMessage::operator<<(&local_80,"Division or mod by zero: dividend.hi=");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,n.lo_);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,", lo=");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,divisor_local.hi_);
    internal::LogFinisher::operator=(local_8d,pLVar3);
    internal::LogMessage::~LogMessage(&local_80);
  }
  bVar1 = operator>((uint128 *)&quotient_ret_local,(uint128 *)&divisor_local.hi_);
  if (bVar1) {
    uint128(&local_a0,0);
    remainder_ret_local->lo_ = local_a0.lo_;
    remainder_ret_local->hi_ = local_a0.hi_;
    local_38->lo_ = divisor_local.hi_;
    local_38->hi_ = n.lo_;
  }
  else {
    bVar1 = protobuf::operator==((uint128 *)&quotient_ret_local,(uint128 *)&divisor_local.hi_);
    if (bVar1) {
      uint128(&local_b0,1);
      remainder_ret_local->lo_ = local_b0.lo_;
      remainder_ret_local->hi_ = local_b0.hi_;
      uint128((uint128 *)&denominator.hi_,0);
      local_38->lo_ = denominator.hi_;
      local_38->hi_ = local_b8;
    }
    else {
      position.hi_ = (uint64)quotient_ret_local;
      denominator.lo_ = divisor_local.lo_;
      uint128((uint128 *)&quotient.hi_,1);
      uint128((uint128 *)auStack_f0,0);
      local_108 = divisor_local.hi_;
      n.hi_ = extraout_RDX;
      local_100 = n.lo_;
      iVar2 = Fls128((protobuf *)divisor_local.hi_,n);
      local_118 = position.hi_;
      local_110 = denominator.lo_;
      n_00.hi_ = extraout_RDX_00;
      n_00.lo_ = denominator.lo_;
      local_f4 = Fls128((protobuf *)position.hi_,n_00);
      local_f4 = iVar2 - local_f4;
      operator<<=((uint128 *)&position.hi_,local_f4);
      operator<<=((uint128 *)&quotient.hi_,local_f4);
      while( true ) {
        uint128(&local_128,0);
        bVar1 = operator>((uint128 *)&quotient.hi_,&local_128);
        if (!bVar1) break;
        bVar1 = operator>=((uint128 *)&divisor_local.hi_,(uint128 *)&position.hi_);
        if (bVar1) {
          operator-=((uint128 *)&divisor_local.hi_,(uint128 *)&position.hi_);
          operator|=((uint128 *)auStack_f0,(uint128 *)&quotient.hi_);
        }
        operator>>=((uint128 *)&quotient.hi_,1);
        operator>>=((uint128 *)&position.hi_,1);
      }
      remainder_ret_local->lo_ = _auStack_f0;
      remainder_ret_local->hi_ = quotient.lo_;
      local_38->lo_ = divisor_local.hi_;
      local_38->hi_ = n.lo_;
    }
  }
  return;
}

Assistant:

void uint128::DivModImpl(uint128 dividend, uint128 divisor,
                         uint128* quotient_ret, uint128* remainder_ret) {
  if (divisor == 0) {
    GOOGLE_LOG(FATAL) << "Division or mod by zero: dividend.hi=" << dividend.hi_
                      << ", lo=" << dividend.lo_;
  }

  if (divisor > dividend) {
    *quotient_ret = 0;
    *remainder_ret = dividend;
    return;
  }

  if (divisor == dividend) {
    *quotient_ret = 1;
    *remainder_ret = 0;
    return;
  }

  uint128 denominator = divisor;
  uint128 position = 1;
  uint128 quotient = 0;

  // Left aligns the MSB of the denominator and the dividend.
  int shift = Fls128(dividend) - Fls128(denominator);
  denominator <<= shift;
  position <<= shift;

  // Uses shift-subtract algorithm to divide dividend by denominator. The
  // remainder will be left in dividend.
  while (position > 0) {
    if (dividend >= denominator) {
      dividend -= denominator;
      quotient |= position;
    }
    position >>= 1;
    denominator >>= 1;
  }

  *quotient_ret = quotient;
  *remainder_ret = dividend;
}